

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

Dsd_Node_t * Dsd_TreeNodeCreate(int Type,int nDecs,int BlockNum)

{
  Dsd_Node_t *__s;
  Dsd_Node_t **ppDVar1;
  Dsd_Node_t *p;
  int BlockNum_local;
  int nDecs_local;
  int Type_local;
  
  __s = (Dsd_Node_t *)malloc(0x28);
  memset(__s,0,0x28);
  __s->Type = Type;
  __s->nDecs = (short)nDecs;
  if (__s->nDecs != 0) {
    ppDVar1 = (Dsd_Node_t **)malloc((long)__s->nDecs << 3);
    __s->pDecs = ppDVar1;
    *__s->pDecs = (Dsd_Node_t *)0x0;
  }
  return __s;
}

Assistant:

Dsd_Node_t * Dsd_TreeNodeCreate( int Type, int nDecs, int BlockNum )
{
    // allocate memory for this node 
    Dsd_Node_t * p = (Dsd_Node_t *) ABC_ALLOC( char, sizeof(Dsd_Node_t) );
    memset( p, 0, sizeof(Dsd_Node_t) );
    p->Type       = (Dsd_Type_t)Type;       // the type of this block
    p->nDecs      = nDecs;                  // the number of decompositions
    if ( p->nDecs )
    {
        p->pDecs      = (Dsd_Node_t **) ABC_ALLOC( char, p->nDecs * sizeof(Dsd_Node_t *) );
        p->pDecs[0]   = NULL;
    }
    return p;
}